

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concat.cpp
# Opt level: O3

int __thiscall
ncnn::Concat::forward
          (Concat *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint _c;
  size_t _elemsize;
  Mat *pMVar2;
  int iVar3;
  pointer pMVar4;
  pointer pMVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  pointer pMVar12;
  int *piVar13;
  void *pvVar14;
  size_t sVar15;
  ulong uVar16;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pMVar5->dims;
  _elemsize = pMVar5->elemsize;
  if (uVar1 == 1) {
    lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar5;
    if (lVar11 == 0) {
      iVar10 = 0;
    }
    else {
      lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      piVar13 = &pMVar5->w;
      iVar10 = 0;
      do {
        iVar10 = iVar10 + *piVar13;
        piVar13 = piVar13 + 0x12;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    Mat::create(pMVar2,iVar10,_elemsize,opt->blob_allocator);
    pvVar14 = pMVar2->data;
    if (pvVar14 == (void *)0x0) {
      return -100;
    }
    if ((long)pMVar2->c * pMVar2->cstep == 0) {
      return -100;
    }
    pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
        super__Vector_impl_data._M_finish != pMVar5) {
      lVar11 = 0;
      uVar9 = 0;
      do {
        sVar15 = (long)*(int *)((long)&pMVar5->w + lVar11) * _elemsize;
        memcpy(pvVar14,*(void **)((long)&pMVar5->data + lVar11),sVar15);
        pvVar14 = (void *)((long)pvVar14 + sVar15);
        uVar9 = uVar9 + 1;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = lVar11 + 0x48;
      } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >> 3)
                              * -0x71c71c71c71c71c7));
    }
  }
  else {
    iVar10 = (this->axis >> 0x1f & uVar1) + this->axis;
    if ((uVar1 == 2) && (iVar10 == 0)) {
      iVar10 = pMVar5->w;
      lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar11 == 0) {
        iVar3 = 0;
      }
      else {
        lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        piVar13 = &pMVar5->h;
        iVar3 = 0;
        do {
          iVar3 = iVar3 + *piVar13;
          piVar13 = piVar13 + 0x12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar10,iVar3,_elemsize,opt->blob_allocator);
      pvVar14 = pMVar2->data;
      if (pvVar14 == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar5) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          sVar15 = (long)*(int *)((long)&pMVar5->h + lVar11) * (long)iVar10 * _elemsize;
          memcpy(pvVar14,*(void **)((long)&pMVar5->data + lVar11),sVar15);
          pvVar14 = (void *)((long)pvVar14 + sVar15);
          uVar9 = uVar9 + 1;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x48;
        } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    else if ((uVar1 == 2) && (iVar10 == 1)) {
      uVar1 = pMVar5->h;
      lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar11 == 0) {
        iVar10 = 0;
      }
      else {
        lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        piVar13 = &pMVar5->w;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + *piVar13;
          piVar13 = piVar13 + 0x12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar10,uVar1,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        uVar9 = 0;
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pMVar12 = pMVar5;
          if (pMVar4 != pMVar5) {
            pvVar14 = (void *)((long)pMVar2->w * uVar9 * pMVar2->elemsize + (long)pMVar2->data);
            lVar11 = 0x2c;
            uVar16 = 0;
            do {
              lVar6 = (long)*(int *)((long)&pMVar12->data + lVar11);
              memcpy(pvVar14,(void *)(uVar9 * lVar6 * *(long *)((long)pMVar12 + lVar11 + -0x1c) +
                                     *(long *)((long)pMVar12 + lVar11 + -0x2c)),lVar6 * _elemsize);
              pvVar14 = (void *)((long)pvVar14 +
                                (long)*(int *)((long)&pMVar12->data + lVar11) * _elemsize);
              uVar16 = uVar16 + 1;
              pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              lVar11 = lVar11 + 0x48;
            } while (uVar16 < (ulong)(((long)pMVar5 - (long)pMVar12 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar9 = uVar9 + 1;
          pMVar4 = pMVar5;
          pMVar5 = pMVar12;
        } while (uVar9 != uVar1);
        return 0;
      }
    }
    else if ((uVar1 == 3) && (iVar10 == 0)) {
      lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar11 == 0) {
        iVar10 = 0;
      }
      else {
        lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        piVar13 = &pMVar5->c;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + *piVar13;
          piVar13 = piVar13 + 0x12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,pMVar5->w,pMVar5->h,iVar10,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
          super__Vector_impl_data._M_finish != pMVar5) {
        lVar11 = 0x40;
        iVar10 = 0;
        uVar9 = 0;
        do {
          iVar3 = *(int *)((long)pMVar5 + lVar11 + -8);
          memcpy((void *)(pMVar2->cstep * (long)iVar10 * pMVar2->elemsize + (long)pMVar2->data),
                 *(void **)((long)pMVar5 + lVar11 + -0x40),
                 (long)iVar3 * _elemsize * *(long *)((long)&pMVar5->data + lVar11));
          iVar10 = iVar10 + iVar3;
          uVar9 = uVar9 + 1;
          pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          lVar11 = lVar11 + 0x48;
        } while (uVar9 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    else if ((uVar1 == 3) && (iVar10 == 1)) {
      uVar1 = pMVar5->c;
      lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar11 == 0) {
        iVar10 = 0;
      }
      else {
        lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        piVar13 = &pMVar5->h;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + *piVar13;
          piVar13 = piVar13 + 0x12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,pMVar5->w,iVar10,uVar1,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)uVar1) {
        uVar9 = 0;
        pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          pMVar12 = pMVar5;
          if (pMVar4 != pMVar5) {
            pvVar14 = (void *)(pMVar2->cstep * uVar9 * pMVar2->elemsize + (long)pMVar2->data);
            lVar11 = 0x40;
            uVar16 = 0;
            do {
              sVar15 = (long)*(int *)((long)pMVar12 + lVar11 + -0x10) *
                       (long)*(int *)((long)pMVar12 + lVar11 + -0x14) * _elemsize;
              memcpy(pvVar14,(void *)(*(long *)((long)&pMVar12->data + lVar11) * uVar9 *
                                      *(long *)((long)pMVar12 + lVar11 + -0x30) +
                                     *(long *)((long)pMVar12 + lVar11 + -0x40)),sVar15);
              pvVar14 = (void *)((long)pvVar14 + sVar15);
              uVar16 = uVar16 + 1;
              pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
              lVar11 = lVar11 + 0x48;
            } while (uVar16 < (ulong)(((long)pMVar5 - (long)pMVar12 >> 3) * -0x71c71c71c71c71c7));
          }
          uVar9 = uVar9 + 1;
          pMVar4 = pMVar5;
          pMVar5 = pMVar12;
        } while (uVar9 != uVar1);
        return 0;
      }
    }
    else {
      if (uVar1 != 3) {
        return 0;
      }
      if (iVar10 != 2) {
        return 0;
      }
      uVar1 = pMVar5->h;
      _c = pMVar5->c;
      lVar11 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pMVar5;
      if (lVar11 == 0) {
        iVar10 = 0;
      }
      else {
        lVar11 = (lVar11 >> 3) * -0x71c71c71c71c71c7;
        lVar11 = lVar11 + (ulong)(lVar11 == 0);
        piVar13 = &pMVar5->w;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + *piVar13;
          piVar13 = piVar13 + 0x12;
          lVar11 = lVar11 + -1;
        } while (lVar11 != 0);
      }
      pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      Mat::create(pMVar2,iVar10,uVar1,_c,_elemsize,opt->blob_allocator);
      if (pMVar2->data == (void *)0x0) {
        return -100;
      }
      if ((long)pMVar2->c * pMVar2->cstep == 0) {
        return -100;
      }
      if (0 < (int)_c) {
        uVar9 = 0;
        do {
          if (0 < (int)uVar1) {
            pvVar14 = (void *)(pMVar2->cstep * uVar9 * pMVar2->elemsize + (long)pMVar2->data);
            uVar16 = 0;
            pMVar4 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
            pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            do {
              pMVar12 = pMVar5;
              if (pMVar4 != pMVar5) {
                lVar11 = 0x40;
                uVar8 = 0;
                do {
                  lVar7 = (long)*(int *)((long)pMVar12 + lVar11 + -0x14);
                  lVar6 = *(long *)((long)pMVar12 + lVar11 + -0x30);
                  memcpy(pvVar14,(void *)(uVar16 * lVar7 * lVar6 +
                                         *(long *)((long)&pMVar12->data + lVar11) * uVar9 * lVar6 +
                                         *(long *)((long)pMVar12 + lVar11 + -0x40)),
                         lVar7 * _elemsize);
                  pvVar14 = (void *)((long)*(int *)((long)pMVar12 + lVar11 + -0x14) * _elemsize +
                                    (long)pvVar14);
                  uVar8 = uVar8 + 1;
                  pMVar12 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                           ._M_impl.super__Vector_impl_data._M_finish;
                  lVar11 = lVar11 + 0x48;
                } while (uVar8 < (ulong)(((long)pMVar5 - (long)pMVar12 >> 3) * -0x71c71c71c71c71c7))
                ;
              }
              uVar16 = uVar16 + 1;
              pMVar4 = pMVar5;
              pMVar5 = pMVar12;
            } while (uVar16 != uVar1);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != _c);
        return 0;
      }
    }
  }
  return 0;
}

Assistant:

int Concat::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int dims = bottom_blobs[0].dims;
    size_t elemsize = bottom_blobs[0].elemsize;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        // concat vector
        // total length
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int w = bottom_blob.w;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, w * elemsize);

            outptr += w * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        // concat image
        int w = bottom_blobs[0].w;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        unsigned char* outptr = top_blob;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int size = w * bottom_blob.h;

            const unsigned char* ptr = bottom_blob;
            memcpy(outptr, ptr, size * elemsize);

            outptr += size * elemsize;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        // interleave image row
        int h = bottom_blobs[0].h;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            unsigned char* outptr = top_blob.row<unsigned char>(i);
            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                const unsigned char* ptr = bottom_blob.row<const unsigned char>(i);
                memcpy(outptr, ptr, bottom_blob.w * elemsize);

                outptr += bottom_blob.w * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 0)
    {
        // concat dim
        int w = bottom_blobs[0].w;
        int h = bottom_blobs[0].h;

        // total channels
        int top_channels = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_channels += bottom_blob.c;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, h, top_channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int q = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];

            int channels = bottom_blob.c;
            size_t size = bottom_blob.cstep * channels;

            const unsigned char* ptr = bottom_blob;
            unsigned char* outptr = top_blob.channel(q);
            memcpy(outptr, ptr, size * elemsize);

            q += channels;
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 1)
    {
        // interleave dim height
        int w = bottom_blobs[0].w;
        int channels = bottom_blobs[0].c;

        // total height
        int top_h = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_h += bottom_blob.h;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(w, top_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (size_t b = 0; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob = bottom_blobs[b];

                int size = bottom_blob.w * bottom_blob.h;

                const unsigned char* ptr = bottom_blob.channel(q);
                memcpy(outptr, ptr, size * elemsize);

                outptr += size * elemsize;
            }
        }

        return 0;
    }

    if (dims == 3 && positive_axis == 2)
    {
        // interleave dim width
        int h = bottom_blobs[0].h;
        int channels = bottom_blobs[0].c;

        // total width
        int top_w = 0;
        for (size_t b = 0; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob = bottom_blobs[b];
            top_w += bottom_blob.w;
        }

        Mat& top_blob = top_blobs[0];
        top_blob.create(top_w, h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            unsigned char* outptr = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                for (size_t b = 0; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob = bottom_blobs[b];

                    const unsigned char* ptr = bottom_blob.channel(q).row<const unsigned char>(i);
                    memcpy(outptr, ptr, bottom_blob.w * elemsize);

                    outptr += bottom_blob.w * elemsize;
                }
            }
        }

        return 0;
    }

    return 0;
}